

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O1

void TTD::NSLogEvents::DefinePropertyAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  BOOL BVar1;
  ScriptContext *scriptContext;
  Var instance;
  RecyclableObject *pRVar2;
  Var instance_00;
  undefined1 local_60 [8];
  PropertyDescriptor propertyDescriptorValue;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  if (evt->EventKind == DefinePropertyActionTag) {
    instance = InflateVarInReplay(executeContext,(TTDVar)evt[1].EventTimeStamp);
    if (instance != (Var)0x0) {
      BVar1 = Js::JavascriptOperators::IsObject(instance);
      if (BVar1 != 0) {
        pRVar2 = Js::VarTo<Js::RecyclableObject>(instance);
        if ((((((pRVar2->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr != scriptContext) {
          instance = Js::CrossSite::MarshalVar(scriptContext,pRVar2,false);
        }
        instance_00 = InflateVarInReplay(executeContext,*(TTDVar *)(evt + 2));
        if (instance_00 != (Var)0x0) {
          BVar1 = Js::JavascriptOperators::IsObject(instance_00);
          if (BVar1 != 0) {
            pRVar2 = Js::VarTo<Js::RecyclableObject>(instance_00);
            if ((((((pRVar2->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                scriptContext.ptr != scriptContext) {
              instance_00 = Js::CrossSite::MarshalVar(scriptContext,pRVar2,false);
            }
            Js::PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_60);
            Js::JavascriptOperators::ToPropertyDescriptor
                      (instance_00,(PropertyDescriptor *)local_60,scriptContext);
            pRVar2 = Js::VarTo<Js::RecyclableObject>(instance);
            Js::JavascriptOperators::DefineOwnPropertyDescriptor
                      (pRVar2,(PropertyId)evt[2].EventTimeStamp,(PropertyDescriptor *)local_60,true,
                       scriptContext,PropertyOperation_None);
          }
        }
      }
    }
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void DefinePropertyAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTDoubleVarSingleScalarArgumentAction* action = GetInlineEventDataAs<JsRTDoubleVarSingleScalarArgumentAction, EventKind::DefinePropertyActionTag>(evt);
            Js::Var object = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_OBJECT(object, ctx);
            Js::Var propertyDescriptor = InflateVarInReplay(executeContext, GetVarItem_1(action));
            TTD_REPLAY_VALIDATE_INCOMING_OBJECT(propertyDescriptor, ctx);

            Js::PropertyDescriptor propertyDescriptorValue;
            Js::JavascriptOperators::ToPropertyDescriptor(propertyDescriptor, &propertyDescriptorValue, ctx);

            Js::JavascriptOperators::DefineOwnPropertyDescriptor(Js::VarTo<Js::RecyclableObject>(object), GetPropertyIdItem(action), propertyDescriptorValue, true, ctx);
        }